

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void lace_yield(WorkerP *__lace_worker,Task *__lace_dq_head)

{
  undefined1 local_58 [8];
  Task _t;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  
  _t.d._40_8_ = __lace_dq_head;
  memcpy(local_58,lace_newframe.t,0x40);
  lace_barrier();
  lace_exec_in_new_frame(__lace_worker,(Task *)_t.d._40_8_,(Task *)local_58);
  return;
}

Assistant:

void
lace_yield(WorkerP *__lace_worker, Task *__lace_dq_head)
{
    // make a local copy of the task
    Task _t;
    memcpy(&_t, lace_newframe.t, sizeof(Task));

    // wait until all workers have made a local copy
    lace_barrier();

    lace_exec_in_new_frame(__lace_worker, __lace_dq_head, &_t);
}